

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepTiledOutputFile::copyPixels(DeepTiledOutputFile *this,DeepTiledInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  Data *pDVar3;
  pthread_mutex_t *__mutex;
  bool bVar4;
  Header *this_00;
  TileDescription *this_01;
  TileDescription *other;
  Box2i *this_02;
  Box2i *src;
  LineOrder *pLVar5;
  Compression *pCVar6;
  ChannelList *this_03;
  ChannelList *other_00;
  size_t sVar7;
  ArgExc *pAVar8;
  ostream *poVar9;
  char *pcVar10;
  LogicExc *this_04;
  size_type sVar11;
  size_t i;
  ulong uVar12;
  size_type __n;
  TileCoord TVar13;
  int dx;
  int ly;
  int lx;
  int dy;
  uint64_t dataSize;
  vector<char,_std::allocator<char>_> data;
  vector<int,_std::allocator<int>_> ly_list;
  vector<int,_std::allocator<int>_> lx_list;
  vector<int,_std::allocator<int>_> dy_list;
  vector<int,_std::allocator<int>_> dx_list;
  
  pDVar3 = this->_data;
  this_00 = DeepTiledInputFile::header(in);
  this_01 = Header::tileDescription(&pDVar3->header);
  other = Header::tileDescription(this_00);
  bVar4 = TileDescription::operator==(this_01,other);
  if (!bVar4) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_list);
    poVar9 = std::operator<<((ostream *)
                             &dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             "Quick pixel copy from image file \"");
    pcVar10 = DeepTiledInputFile::fileName(in);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"\" to image file \"");
    pcVar10 = fileName(this);
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::operator<<(poVar9,"\" failed. The files have different tile descriptions.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar8,(stringstream *)&dx_list);
    __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  this_02 = Header::dataWindow(&pDVar3->header);
  src = Header::dataWindow(this_00);
  bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(this_02,src);
  if (!bVar4) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_list);
    poVar9 = std::operator<<((ostream *)
                             &dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             "Cannot copy pixels from image file \"");
    pcVar10 = DeepTiledInputFile::fileName(in);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"\" to image file \"");
    pcVar10 = fileName(this);
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::operator<<(poVar9,"\". The files have different data windows.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar8,(stringstream *)&dx_list);
    __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pLVar5 = Header::lineOrder(&pDVar3->header);
  LVar1 = *pLVar5;
  pLVar5 = Header::lineOrder(this_00);
  if (LVar1 != *pLVar5) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_list);
    poVar9 = std::operator<<((ostream *)
                             &dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             "Quick pixel copy from image file \"");
    pcVar10 = DeepTiledInputFile::fileName(in);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"\" to image file \"");
    pcVar10 = fileName(this);
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::operator<<(poVar9,"\" failed. The files have different line orders.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar8,(stringstream *)&dx_list);
    __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pCVar6 = Header::compression(&pDVar3->header);
  CVar2 = *pCVar6;
  pCVar6 = Header::compression(this_00);
  if (CVar2 == *pCVar6) {
    this_03 = Header::channels(&pDVar3->header);
    other_00 = Header::channels(this_00);
    bVar4 = ChannelList::operator==(this_03,other_00);
    if (!bVar4) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&dx_list);
      poVar9 = std::operator<<((ostream *)
                               &dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,
                               "Quick pixel copy from image file \"");
      pcVar10 = DeepTiledInputFile::fileName(in);
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9,"\" to image file \"");
      pcVar10 = fileName(this);
      poVar9 = std::operator<<(poVar9,pcVar10);
      std::operator<<(poVar9,"\" failed.  The files have different channel lists.");
      pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar8,(stringstream *)&dx_list);
      __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    bVar4 = TileOffsets::isEmpty(&this->_data->tileOffsets);
    if (bVar4) {
      sVar7 = DeepTiledInputFile::totalTiles(in);
      __mutex = (pthread_mutex_t *)this->_data->_streamData;
      std::mutex::lock((mutex *)&__mutex->__data);
      __n = 1;
      sVar11 = __n;
      if (this->_data->lineOrder == RANDOM_Y) {
        sVar11 = sVar7;
      }
      std::vector<int,_std::allocator<int>_>::vector(&dx_list,sVar11,(allocator_type *)&dy_list);
      sVar11 = __n;
      if (this->_data->lineOrder == RANDOM_Y) {
        sVar11 = sVar7;
      }
      std::vector<int,_std::allocator<int>_>::vector(&dy_list,sVar11,(allocator_type *)&lx_list);
      sVar11 = __n;
      if (this->_data->lineOrder == RANDOM_Y) {
        sVar11 = sVar7;
      }
      std::vector<int,_std::allocator<int>_>::vector(&lx_list,sVar11,(allocator_type *)&ly_list);
      if (this->_data->lineOrder == RANDOM_Y) {
        __n = sVar7;
      }
      std::vector<int,_std::allocator<int>_>::vector(&ly_list,__n,(allocator_type *)&data);
      if (this->_data->lineOrder == RANDOM_Y) {
        DeepTiledInputFile::getTileOrder
                  (in,dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                   dy_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   lx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   ly_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        pDVar3 = this->_data;
        (pDVar3->nextTileToWrite).dx =
             *dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
        (pDVar3->nextTileToWrite).dy =
             *dy_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
        (pDVar3->nextTileToWrite).lx =
             *lx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
        (pDVar3->nextTileToWrite).ly =
             *ly_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
      }
      std::vector<char,_std::allocator<char>_>::vector(&data,0x1000,(allocator_type *)&dataSize);
      for (uVar12 = 0; sVar7 != uVar12; uVar12 = uVar12 + 1) {
        pDVar3 = this->_data;
        dx = (pDVar3->nextTileToWrite).dx;
        dy = (pDVar3->nextTileToWrite).dy;
        lx = (pDVar3->nextTileToWrite).lx;
        ly = (pDVar3->nextTileToWrite).ly;
        dataSize = (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        DeepTiledInputFile::rawTileData
                  (in,&dx,&dy,&lx,&ly,
                   data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,&dataSize);
        if ((ulong)((long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start) < dataSize) {
          std::vector<char,_std::allocator<char>_>::resize(&data,dataSize);
          DeepTiledInputFile::rawTileData
                    (in,&dx,&dy,&lx,&ly,
                     data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,&dataSize);
        }
        anon_unknown_8::writeTileData
                  (this->_data,dx,dy,lx,ly,
                   data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   *(uint64_t *)
                    (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x10) + 0x28,
                   *(uint64_t *)
                    (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x18),
                   *(uint64_t *)
                    (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x20),
                   data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x28,
                   *(uint64_t *)
                    (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x10));
        pDVar3 = this->_data;
        if (pDVar3->lineOrder == RANDOM_Y) {
          if (uVar12 < sVar7 - 1) {
            (pDVar3->nextTileToWrite).dx =
                 dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12 + 1];
            (pDVar3->nextTileToWrite).dy =
                 dy_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12 + 1];
            (pDVar3->nextTileToWrite).lx =
                 lx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12 + 1];
            (pDVar3->nextTileToWrite).ly =
                 ly_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12 + 1];
          }
        }
        else {
          TVar13 = Data::nextTileCoord(pDVar3,&pDVar3->nextTileToWrite);
          this->_data->nextTileToWrite = TVar13;
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&data.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&ly_list.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&lx_list.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dy_list.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dx_list.super__Vector_base<int,_std::allocator<int>_>);
      pthread_mutex_unlock(__mutex);
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_list);
    poVar9 = std::operator<<((ostream *)
                             &dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             "Quick pixel copy from image file \"");
    pcVar10 = DeepTiledInputFile::fileName(in);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"\" to image file \"");
    pcVar10 = OStream::fileName(this->_data->_streamData->os);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"\" failed. \"");
    pcVar10 = fileName(this);
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::operator<<(poVar9,"\" already contains pixel data.");
    this_04 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::LogicExc::LogicExc(this_04,(stringstream *)&dx_list);
    __cxa_throw(this_04,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&dx_list);
  poVar9 = std::operator<<((ostream *)
                           &dx_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           "Quick pixel copy from image file \"");
  pcVar10 = DeepTiledInputFile::fileName(in);
  poVar9 = std::operator<<(poVar9,pcVar10);
  poVar9 = std::operator<<(poVar9,"\" to image file \"");
  pcVar10 = fileName(this);
  poVar9 = std::operator<<(poVar9,pcVar10);
  std::operator<<(poVar9,"\" failed. The files use different compression methods.");
  pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar8,(stringstream *)&dx_list);
  __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::copyPixels (DeepTiledInputFile& in)
{

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _data->_streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    size_t numAllTiles = in.totalTiles ();

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // special handling for random tiles
    //

    vector<int> dx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> dy_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> lx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> ly_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);

    if (_data->lineOrder == RANDOM_Y)
    {
        in.getTileOrder (&dx_list[0], &dy_list[0], &lx_list[0], &ly_list[0]);
        _data->nextTileToWrite.dx = dx_list[0];
        _data->nextTileToWrite.dy = dy_list[0];
        _data->nextTileToWrite.lx = lx_list[0];
        _data->nextTileToWrite.ly = ly_list[0];
    }

    vector<char> data (4096);
    for (size_t i = 0; i < numAllTiles; ++i)
    {

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        uint64_t dataSize = data.size ();

        in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            data.resize (dataSize);
            in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        }
        uint64_t sampleCountTableSize  = *(uint64_t*) (&data[0] + 16);
        uint64_t pixelDataSize         = *(uint64_t*) (&data[0] + 24);
        uint64_t unpackedPixelDataSize = *(uint64_t*) (&data[0] + 32);
        char*    sampleCountTable      = &data[0] + 40;
        char*    pixelData = sampleCountTable + sampleCountTableSize;

        writeTileData (
            _data,
            dx,
            dy,
            lx,
            ly,
            pixelData,
            pixelDataSize,
            unpackedPixelDataSize,
            sampleCountTable,
            sampleCountTableSize);

        if (_data->lineOrder == RANDOM_Y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_list[i + 1];
                _data->nextTileToWrite.dy = dy_list[i + 1];
                _data->nextTileToWrite.lx = lx_list[i + 1];
                _data->nextTileToWrite.ly = ly_list[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}